

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ListCosineSimilarityFun::GetFunctions(void)

{
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  ScalarFunction *func;
  pointer function;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  LogicalType *child;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  LogicalType list;
  undefined4 in_stack_fffffffffffffb94;
  undefined4 in_stack_fffffffffffffb9c;
  FunctionNullHandling in_stack_fffffffffffffba8;
  allocator_type local_451;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  code *local_428;
  _func_int **local_420;
  vector<duckdb::ScalarFunction,_true> *local_418;
  undefined1 local_410 [48];
  _Any_data *local_3e0;
  _Any_data *local_3d8;
  LogicalType *local_3d0;
  LogicalType *local_3c8;
  LogicalType *local_3c0;
  string local_3b0;
  LogicalType local_390;
  LogicalType local_378;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_360 [24];
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"list_cosine_similarity","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  LogicalType::Real();
  local_3d0 = local_3c0;
  if (local_3c8 != local_3c0) {
    local_418 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_3e0 = (_Any_data *)&local_208.function;
    local_3d8 = (_Any_data *)&local_330.function;
    local_420 = (_func_int **)&PTR__ScalarFunction_02433f30;
    local_428 = ::std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_manager;
    child = local_3c8;
    do {
      LogicalType::LIST(&local_348,child);
      if (child->id_ == DOUBLE) {
        LogicalType::LogicalType((LogicalType *)local_410,&local_348);
        LogicalType::LogicalType((LogicalType *)(local_410 + 0x18),&local_348);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_410;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (local_360,__l_00,&local_451);
        LogicalType::LogicalType(&local_378,child);
        local_448._8_8_ = 0;
        local_448._0_8_ = ListGenericFold<double,duckdb::CosineSimilarityOp>;
        local_438._8_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_438._0_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_390,INVALID);
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_00._0_8_ = &local_390;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffb94;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffb9c;
        ScalarFunction::ScalarFunction
                  (&local_208,(vector<duckdb::LogicalType,_true> *)local_360,&local_378,
                   (scalar_function_t *)local_448,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffffba8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_418->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_208);
        local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_420;
        if (local_208.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_208.function.super__Function_base._M_manager)
                    (local_3e0,local_3e0,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_390);
        if ((_Manager_type)local_438._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_438._0_8_)(local_448,local_448,3);
        }
        LogicalType::~LogicalType(&local_378);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_360)
        ;
        lVar2 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_410 + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
      }
      else {
        if (child->id_ != FLOAT) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_410._0_8_ = local_410 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_410,"List function not implemented for type %s","");
          LogicalType::ToString_abi_cxx11_((string *)local_448,child);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)local_410,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448)
          ;
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::LogicalType((LogicalType *)local_410,&local_348);
        LogicalType::LogicalType((LogicalType *)(local_410 + 0x18),&local_348);
        __l._M_len = 2;
        __l._M_array = (iterator)local_410;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (local_360,__l,&local_451);
        LogicalType::LogicalType(&local_378,child);
        local_448._8_8_ = 0;
        local_448._0_8_ = ListGenericFold<float,duckdb::CosineSimilarityOp>;
        local_438._8_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_438._0_8_ =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_390,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_390;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffb94;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffb9c;
        ScalarFunction::ScalarFunction
                  (&local_330,(vector<duckdb::LogicalType,_true> *)local_360,&local_378,
                   (scalar_function_t *)local_448,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffba8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_418->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_330);
        local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_420;
        if (local_330.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_330.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_330.function.super__Function_base._M_manager)
                    (local_3d8,local_3d8,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_390);
        if ((_Manager_type)local_438._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_438._0_8_)(local_448,local_448,3);
        }
        LogicalType::~LogicalType(&local_378);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_360)
        ;
        lVar2 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_410 + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
      }
      LogicalType::~LogicalType(&local_348);
      child = child + 1;
    } while (child != local_3d0);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3c8);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListCosineSimilarityFun::GetFunctions() {
	ScalarFunctionSet set("list_cosine_similarity");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<CosineSimilarityOp>(set, type);
	}
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}